

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O2

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 __thiscall
duckdb::ArrowTableFunction::ArrowScanInitLocalInternal
          (ArrowTableFunction *this,ClientContext *context,TableFunctionInitInput *input,
          GlobalTableFunctionState *global_state_p)

{
  TableFilterSet *pTVar1;
  pointer puVar2;
  bool bVar3;
  pointer pAVar4;
  FunctionData *pFVar5;
  type state;
  pointer *__ptr;
  ClientContext *__x;
  ClientContext *context_00;
  ArrowScanGlobalState *asgs;
  templated_unique_single_t current_chunk;
  _Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false> local_38;
  
  context_00 = (ClientContext *)&stack0xffffffffffffffc8;
  make_uniq<duckdb::ArrowArrayWrapper>();
  make_uniq<duckdb::ArrowScanLocalState,duckdb::unique_ptr<duckdb::ArrowArrayWrapper,std::default_delete<duckdb::ArrowArrayWrapper>,true>,duckdb::ClientContext&>
            ((duckdb *)&stack0xffffffffffffffc8,
             (unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>
              *)&stack0xffffffffffffffd0,context);
  pAVar4 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffc8);
  __x = (ClientContext *)&input->column_ids;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pAVar4->column_ids,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
  pTVar1 = (input->filters).ptr;
  pAVar4 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                         *)&stack0xffffffffffffffc8);
  pAVar4->filters = pTVar1;
  pFVar5 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&input->bind_data);
  if (*(char *)&pFVar5[0x1d]._vptr_FunctionData == '\0') {
    pAVar4 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffc8);
    puVar2 = (pAVar4->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pAVar4->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (pAVar4->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
  }
  else if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pAVar4 = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                           *)&stack0xffffffffffffffc8);
    DataChunk::Initialize
              (&pAVar4->all_columns,context,
               (vector<duckdb::LogicalType,_true> *)(global_state_p + 0xd),0x800);
    __x = context;
  }
  state = unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
          ::operator*((unique_ptr<duckdb::ArrowScanLocalState,_std::default_delete<duckdb::ArrowScanLocalState>,_true>
                       *)&stack0xffffffffffffffc8);
  bVar3 = ArrowScanParallelStateNext
                    (context_00,(FunctionData *)__x,state,(ArrowScanGlobalState *)global_state_p);
  if (bVar3) {
    *(ArrowScanLocalState **)this = local_38._M_head_impl;
  }
  else {
    *(undefined8 *)this = 0;
    if ((_Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>)local_38._M_head_impl !=
        (_Head_base<0UL,_duckdb::ArrowScanLocalState_*,_false>)0x0) {
      (*((local_38._M_head_impl)->super_LocalTableFunctionState)._vptr_LocalTableFunctionState[1])()
      ;
    }
  }
  ::std::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>_>
               *)&stack0xffffffffffffffd0);
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )this;
}

Assistant:

unique_ptr<LocalTableFunctionState>
ArrowTableFunction::ArrowScanInitLocalInternal(ClientContext &context, TableFunctionInitInput &input,
                                               GlobalTableFunctionState *global_state_p) {
	auto &global_state = global_state_p->Cast<ArrowScanGlobalState>();
	auto current_chunk = make_uniq<ArrowArrayWrapper>();
	auto result = make_uniq<ArrowScanLocalState>(std::move(current_chunk), context);
	result->column_ids = input.column_ids;
	result->filters = input.filters.get();
	auto &bind_data = input.bind_data->Cast<ArrowScanFunctionData>();
	if (!bind_data.projection_pushdown_enabled) {
		result->column_ids.clear();
	} else if (!input.projection_ids.empty()) {
		auto &asgs = global_state_p->Cast<ArrowScanGlobalState>();
		result->all_columns.Initialize(context, asgs.scanned_types);
	}
	if (!ArrowScanParallelStateNext(context, input.bind_data.get(), *result, global_state)) {
		return nullptr;
	}
	return std::move(result);
}